

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O0

void __thiscall helics::zeromq::ZmqComms::queue_tx_function(ZmqComms *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  string_view message;
  bool bVar1;
  uint uVar2;
  int32_t iVar3;
  ConnectionStatus CVar4;
  size_t sVar5;
  char *p;
  pointer ppVar6;
  size_type sVar7;
  socklen_t __len;
  _Rb_tree_iterator<std::pair<const_helics::route_id,_zmq::socket_t>_> in_RCX;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  int iVar8;
  undefined8 __y;
  CommsInterface *in_RDI;
  int in_R8D;
  string_view sVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_zmq::socket_t>_>,_bool> pVar10;
  error_t *anon_var_0_1;
  iterator rt_find;
  error_t *e_1;
  string str;
  error_t *e;
  socket_t zsock;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  interfaceAndPort;
  bool processed;
  socket_t *in_stack_000005c0;
  ZmqComms *in_stack_000005c8;
  ActionMessage cmd;
  route_id rid;
  bool continueProcessing;
  message_t msg;
  map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
  routes;
  socket_t brokerPushSocket;
  error_t *anon_var_0;
  int res;
  string controlsockString;
  socket_t controlSocket;
  shared_ptr<ZmqContextManager> ctx;
  vector<char,_std::allocator<char>_> buffer;
  undefined4 in_stack_fffffffffffff758;
  int in_stack_fffffffffffff75c;
  ActionMessage *in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff768;
  ConnectionStatus in_stack_fffffffffffff76c;
  CommsInterface *in_stack_fffffffffffff770;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffff778;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff780;
  undefined7 in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff78f;
  _Base_ptr in_stack_fffffffffffff790;
  string *in_stack_fffffffffffff798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7a0;
  string *in_stack_fffffffffffff7c8;
  CommsInterface *in_stack_fffffffffffff7d0;
  char *in_stack_fffffffffffff7d8;
  undefined7 in_stack_fffffffffffff7e0;
  undefined1 in_stack_fffffffffffff7e7;
  _Rb_tree_iterator<std::pair<const_helics::route_id,_zmq::socket_t>_> in_stack_fffffffffffff868;
  allocator<char> local_6e9;
  undefined1 local_6e8 [48];
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffff948;
  allocator<char> local_6a1 [65];
  __sv_type local_660;
  undefined8 local_650;
  const_buffer local_640;
  _Base_ptr local_630;
  const_buffer local_620;
  _Self local_610;
  _Self local_608 [4];
  _Base_ptr local_5e8;
  undefined1 in_stack_fffffffffffffa20;
  undefined7 in_stack_fffffffffffffa21;
  const_buffer local_5d8;
  undefined4 local_5c4;
  undefined8 local_5c0;
  _Base_ptr local_5b0;
  const_buffer local_5a0;
  undefined4 local_58c;
  char *local_588;
  undefined8 local_580;
  char *local_578;
  char *local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  BaseType local_544;
  _Self local_540 [25];
  ActionMessage *in_stack_fffffffffffffb88;
  _Self local_454 [5];
  undefined4 local_42c;
  socket_base local_428 [2];
  allocator<char> local_411;
  size_t local_410;
  undefined8 local_408;
  _Self local_3b8 [4];
  string_view local_398;
  undefined4 local_384;
  BaseType local_370;
  atomic<bool> local_369;
  _Self local_358 [24];
  int local_294;
  route_id local_1e0;
  byte local_1d9;
  undefined1 local_198 [84];
  undefined4 local_144;
  socket_t local_140;
  ConnectionStatus local_124;
  int local_120;
  allocator<char> local_119 [129];
  undefined1 local_98 [36];
  undefined4 local_74;
  socket_t local_70 [5];
  
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x4d53ac);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4d53c0);
  if (!bVar1) {
    CLI::std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffff760,
               SUB41((uint)in_stack_fffffffffffff75c >> 0x18,0));
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff770);
  ZmqContextManager::getContextPointer(in_stack_fffffffffffff7c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff760);
  std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4d5423);
  ZmqContextManager::getBaseContext((ZmqContextManager *)0x4d542b);
  zmq::socket_t::socket_t
            ((socket_t *)in_stack_fffffffffffff780._M_current,
             (context_t *)in_stack_fffffffffffff778._M_current,
             (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
  local_74 = 200;
  zmq::detail::socket_base::setsockopt<int>
            ((socket_base *)in_stack_fffffffffffff760,in_stack_fffffffffffff75c,(int *)0x4d5473);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7a0,(char *)in_stack_fffffffffffff798,
             (allocator<char> *)in_stack_fffffffffffff790);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff760);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                 (char)((ulong)in_stack_fffffffffffff760 >> 0x38));
  CommsInterface::getRandomID_abi_cxx11_(in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff760);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                 (char *)in_stack_fffffffffffff760);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff760);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff760);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff760);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff760);
  std::allocator<char>::~allocator(local_119);
  zmq::detail::socket_base::connect
            (&local_70[0].super_socket_base,(int)local_98,__addr,(socklen_t)in_RCX._M_node);
  local_120 = initializeBrokerConnections(in_stack_000005c8,in_stack_000005c0);
  if (local_120 < 0) {
    iVar8 = (local_120 != -3) + 2 + (uint)(local_120 != -3);
    CommsInterface::setTxStatus(in_stack_fffffffffffff770,in_stack_fffffffffffff76c);
    zmq::socket_t::close(local_70,iVar8);
    local_124 = 1;
  }
  else {
    std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x4d57a8);
    ZmqContextManager::getBaseContext((ZmqContextManager *)0x4d57b0);
    zmq::socket_t::socket_t
              ((socket_t *)in_stack_fffffffffffff780._M_current,
               (context_t *)in_stack_fffffffffffff778._M_current,
               (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
    local_144 = 200;
    zmq::detail::socket_base::setsockopt<int>
              ((socket_base *)in_stack_fffffffffffff760,in_stack_fffffffffffff75c,(int *)0x4d57fb);
    std::
    map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
    ::map((map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
           *)0x4d580a);
    bVar1 = std::atomic::operator_cast_to_bool
                      ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768)
                      );
    if (bVar1) {
      gmlc::networking::makePortAddress
                (in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
      zmq::detail::socket_base::connect
                (&local_140.super_socket_base,(int)local_198,__addr_00,(socklen_t)in_RCX._M_node);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff760);
    }
    __y = (_Self *)0x0;
    CommsInterface::setTxStatus(in_stack_fffffffffffff770,in_stack_fffffffffffff76c);
    zmq::message_t::message_t((message_t *)in_stack_fffffffffffff760);
    local_1d9 = 1;
    do {
      iVar8 = (int)__y;
      if ((local_1d9 & 1) == 0) break;
      route_id::route_id(&local_1e0);
      ActionMessage::ActionMessage((ActionMessage *)in_stack_fffffffffffff770);
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::pop(in_stack_fffffffffffff948);
      std::tie<helics::route_id,helics::ActionMessage>
                ((route_id *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                 in_stack_fffffffffffff760);
      __y = local_358;
      std::tuple<helics::route_id&,helics::ActionMessage&>::operator=
                ((tuple<helics::route_id_&,_helics::ActionMessage_&> *)in_stack_fffffffffffff770,
                 (pair<helics::route_id,_helics::ActionMessage> *)
                 CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
      std::pair<helics::route_id,_helics::ActionMessage>::~pair
                ((pair<helics::route_id,_helics::ActionMessage> *)0x4d5977);
      local_369._M_base._M_i = (__atomic_base<bool>)false;
      bVar1 = isProtocolCommand(in_stack_fffffffffffff760);
      if (bVar1) {
        local_370 = local_1e0.rid;
        __y = ZEXT48((uint)local_1e0.rid);
        bVar1 = route_id::operator==((route_id *)&control_route,local_1e0);
        if (bVar1) {
          if (local_294 == 0xe9) {
            sVar9 = SmallBuffer::to_string((SmallBuffer *)0x4d5bf8);
            local_408 = sVar9._M_str;
            sVar5 = sVar9._M_len;
            local_410 = sVar5;
            std::allocator<char>::allocator();
            __len = (socklen_t)sVar5;
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      (in_stack_fffffffffffff7a0,
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff798
                       ,(allocator<char> *)in_stack_fffffffffffff790);
            gmlc::networking::extractInterfaceAndPort((string *)in_stack_fffffffffffff868._M_node);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff760);
            std::allocator<char>::~allocator(&local_411);
            std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x4d5c9c);
            ZmqContextManager::getBaseContext((ZmqContextManager *)0x4d5ca4);
            zmq::socket_t::socket_t
                      ((socket_t *)in_stack_fffffffffffff780._M_current,
                       (context_t *)in_stack_fffffffffffff778._M_current,
                       (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
            local_42c = 100;
            zmq::detail::socket_base::setsockopt<int>
                      ((socket_base *)in_stack_fffffffffffff760,in_stack_fffffffffffff75c,
                       (int *)0x4d5cef);
            gmlc::networking::makePortAddress
                      (in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
            zmq::detail::socket_base::connect(local_428,(int)local_454 + 4,__addr_02,__len);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff760);
            iVar3 = ActionMessage::getExtraData((ActionMessage *)0x4d5d40);
            __y = local_454;
            route_id::route_id((route_id *)__y,iVar3);
            pVar10 = std::
                     map<helics::route_id,zmq::socket_t,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,zmq::socket_t>>>
                     ::emplace<helics::route_id,zmq::socket_t>
                               ((map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                                 *)in_stack_fffffffffffff770,
                                (route_id *)
                                CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                                (socket_t *)in_stack_fffffffffffff760);
            in_RCX = pVar10.first._M_node;
            in_stack_fffffffffffff868._M_node = in_RCX._M_node;
            zmq::socket_t::~socket_t((socket_t *)0x4d5dbe);
            CLI::std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     *)0x4d5dcb);
            local_369._M_base._M_i = (__atomic_base<bool>)true;
          }
          else if (local_294 == 0xf4) {
            iVar3 = ActionMessage::getExtraData((ActionMessage *)0x4d618f);
            __y = local_540;
            route_id::route_id((route_id *)__y,iVar3);
            std::
            map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
            ::erase((map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                     *)in_stack_fffffffffffff760,
                    (key_type *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
            local_369._M_base._M_i = (__atomic_base<bool>)true;
          }
          else if (local_294 == 0x14d) {
            zmq::socket_t::close(&local_140,(int)__y);
            std::__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x4d5a6e);
            ZmqContextManager::getBaseContext((ZmqContextManager *)0x4d5a76);
            zmq::socket_t::socket_t
                      ((socket_t *)in_stack_fffffffffffff780._M_current,
                       (context_t *)in_stack_fffffffffffff778._M_current,
                       (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
            zmq::socket_t::operator=
                      ((socket_t *)in_stack_fffffffffffff760,
                       (socket_t *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
            zmq::socket_t::~socket_t((socket_t *)0x4d5ace);
            local_384 = 200;
            zmq::detail::socket_base::setsockopt<int>
                      ((socket_base *)in_stack_fffffffffffff760,in_stack_fffffffffffff75c,
                       (int *)0x4d5af3);
            sVar9 = SmallBuffer::to_string((SmallBuffer *)0x4d5b02);
            local_398 = sVar9;
            std::__cxx11::string::operator=
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff760,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
            uVar2 = ActionMessage::getExtraData((ActionMessage *)0x4d5b5f);
            in_RCX._M_node = (_Base_ptr)(ulong)uVar2;
            *(uint *)&in_RDI[1]._vptr_CommsInterface = uVar2;
            gmlc::networking::makePortAddress
                      (in_stack_fffffffffffff798,(int)((ulong)in_stack_fffffffffffff790 >> 0x20));
            __y = local_3b8;
            zmq::detail::socket_base::connect
                      (&local_140.super_socket_base,(int)__y,__addr_01,(socklen_t)in_RCX._M_node);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff760);
          }
          else if (local_294 == 0x7cd) {
            __y = (_Self *)0x0;
            CommsInterface::setTxStatus(in_stack_fffffffffffff770,in_stack_fffffffffffff76c);
          }
          else if (local_294 == 0x9db) {
            local_1d9 = 0;
            local_369._M_base._M_i = (__atomic_base<bool>)true;
          }
        }
      }
      if (((byte)local_369._M_base._M_i & 1) == 0) {
        local_544 = local_1e0.rid;
        iVar3 = getRouteTypeCode((route_id)0x0);
        if ((iVar3 == 10) || ((in_RDI->useJsonSerialization & 1U) != 0)) {
          ActionMessage::to_json_string_abi_cxx11_(in_stack_fffffffffffffb88);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&local_568);
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff780._M_current,
                     (size_type)in_stack_fffffffffffff778._M_current);
          local_570 = (char *)CLI::std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758)
                                   );
          local_578 = (char *)CLI::std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff76c,
                                                     in_stack_fffffffffffff768));
          local_580 = std::vector<char,_std::allocator<char>_>::begin
                                ((vector<char,_std::allocator<char>_> *)
                                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          __first._M_current._7_1_ = in_stack_fffffffffffff78f;
          __first._M_current._0_7_ = in_stack_fffffffffffff788;
          local_588 = (char *)std::
                              copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                                        (__first,in_stack_fffffffffffff780,in_stack_fffffffffffff778
                                        );
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff760);
        }
        else {
          ActionMessage::to_vector
                    ((ActionMessage *)in_stack_fffffffffffff770,
                     (vector<char,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
        }
        local_58c = 0;
        bVar1 = route_id::operator==(&local_1e0,(route_id)0x0);
        if (bVar1) {
          bVar1 = std::atomic::operator_cast_to_bool
                            ((atomic<bool> *)
                             CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
          if (bVar1) {
            p = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)0x4d63a5);
            sVar7 = std::vector<char,_std::allocator<char>_>::size
                              ((vector<char,_std::allocator<char>_> *)&stack0xffffffffffffffe0);
            zmq::const_buffer::const_buffer(&local_5a0,p,sVar7);
            __y = local_5a0._data;
            in_RCX._M_node =
                 (_Base_ptr)
                 zmq::detail::socket_base::send
                           (&local_140.super_socket_base,(int)local_5a0._data,
                            (void *)local_5a0._size,0,in_R8D);
            local_5b0 = in_RCX._M_node;
          }
          else {
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff770
                       ,(char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
            sVar9._M_str._0_7_ = in_stack_fffffffffffff7e0;
            sVar9._M_len = (size_t)in_stack_fffffffffffff7d8;
            sVar9._M_str._7_1_ = in_stack_fffffffffffff7e7;
            __y = local_5c0;
            CommsInterface::logWarning(in_stack_fffffffffffff7d0,sVar9);
          }
        }
        else {
          local_5c4 = 0xffffffff;
          bVar1 = route_id::operator==(&local_1e0,(route_id)0xffffffff);
          if (bVar1) {
            in_stack_fffffffffffff7d0 = (CommsInterface *)&stack0xffffffffffffffe0;
            in_stack_fffffffffffff7d8 =
                 std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x4d6498);
            sVar7 = std::vector<char,_std::allocator<char>_>::size
                              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff7d0);
            zmq::const_buffer::const_buffer(&local_5d8,in_stack_fffffffffffff7d8,sVar7);
            __y = local_5d8._data;
            in_RCX._M_node =
                 (_Base_ptr)
                 zmq::detail::socket_base::send
                           (&local_70[0].super_socket_base,(int)local_5d8._data,
                            (void *)local_5d8._size,1,in_R8D);
            local_124 = TERMINATED;
            in_stack_fffffffffffff7e7 = extraout_DL;
            local_5e8 = in_RCX._M_node;
            in_stack_fffffffffffffa20 = extraout_DL;
            goto LAB_004d6940;
          }
          local_608[0]._M_node =
               (_Base_ptr)
               std::
               map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
               ::find((map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                       *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                      (key_type *)0x4d6644);
          local_610._M_node =
               (_Base_ptr)
               std::
               map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
               ::end((map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
                      *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          __y = &local_610;
          bVar1 = std::operator==(local_608,(_Self *)__y);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            bVar1 = std::atomic::operator_cast_to_bool
                              ((atomic<bool> *)
                               CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
            if (bVar1) {
              in_stack_fffffffffffff778._M_current = &stack0xffffffffffffffe0;
              in_stack_fffffffffffff780._M_current =
                   std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x4d6749);
              sVar7 = std::vector<char,_std::allocator<char>_>::size
                                ((vector<char,_std::allocator<char>_> *)
                                 in_stack_fffffffffffff778._M_current);
              zmq::const_buffer::const_buffer(&local_640,in_stack_fffffffffffff780._M_current,sVar7)
              ;
              __y = local_640._data;
              in_RCX._M_node =
                   (_Base_ptr)
                   zmq::detail::socket_base::send
                             (&local_140.super_socket_base,(int)local_640._data,
                              (void *)local_640._size,0,in_R8D);
              in_stack_fffffffffffff78f = extraout_DL_00;
              in_stack_fffffffffffff790 = in_RCX._M_node;
              local_650 = in_RCX._M_node;
            }
            else {
              bVar1 = isIgnoreableCommand((ActionMessage *)
                                          CONCAT44(in_stack_fffffffffffff75c,
                                                   in_stack_fffffffffffff758));
              if (!bVar1) {
                in_stack_fffffffffffff770 = (CommsInterface *)local_6a1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff7a0,(char *)in_stack_fffffffffffff798,
                           (allocator<char> *)in_stack_fffffffffffff790);
                prettyPrintString_abi_cxx11_
                          ((ActionMessage *)
                           CONCAT71(in_stack_fffffffffffffa21,in_stack_fffffffffffffa20));
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff798,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff790);
                local_660 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff760);
                message._M_str._0_7_ = in_stack_fffffffffffff7e0;
                message._M_len = (size_t)in_stack_fffffffffffff7d8;
                message._M_str._7_1_ = in_stack_fffffffffffff7e7;
                __y = local_660._M_len;
                CommsInterface::logWarning(in_stack_fffffffffffff7d0,message);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff760);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff760);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff760);
                std::allocator<char>::~allocator(local_6a1);
              }
            }
          }
          else {
            ppVar6 = std::_Rb_tree_iterator<std::pair<const_helics::route_id,_zmq::socket_t>_>::
                     operator->((_Rb_tree_iterator<std::pair<const_helics::route_id,_zmq::socket_t>_>
                                 *)0x4d669a);
            in_stack_fffffffffffff798 = (string *)&stack0xffffffffffffffe0;
            in_stack_fffffffffffff7a0 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x4d66b5);
            sVar7 = std::vector<char,_std::allocator<char>_>::size
                              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff798);
            zmq::const_buffer::const_buffer(&local_620,in_stack_fffffffffffff7a0,sVar7);
            __y = local_620._data;
            in_RCX._M_node =
                 (_Base_ptr)
                 zmq::detail::socket_base::send
                           (&(ppVar6->second).super_socket_base,(int)local_620._data,
                            (void *)local_620._size,0,in_R8D);
            local_630 = in_RCX._M_node;
          }
        }
        local_124 = CONNECTED;
      }
      else {
        local_124 = TERMINATED;
      }
LAB_004d6940:
      ActionMessage::~ActionMessage(in_stack_fffffffffffff760);
      iVar8 = (int)__y;
      in_stack_fffffffffffff76c = local_124;
    } while ((local_124 == CONNECTED) || (local_124 == TERMINATED));
    zmq::socket_t::close(&local_140,iVar8);
    std::
    map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
    ::clear((map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
             *)0x4d69a0);
    CVar4 = CommsInterface::getRxStatus((CommsInterface *)0x4d69ad);
    if (CVar4 == CONNECTED) {
      in_stack_fffffffffffff760 = (ActionMessage *)&local_6e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff7a0,(char *)in_stack_fffffffffffff798,
                 (allocator<char> *)in_stack_fffffffffffff790);
      iVar8 = (int)local_6e8;
      zmq::detail::socket_base::send
                (&local_70[0].super_socket_base,iVar8,(void *)0x1,(size_t)in_RCX._M_node,in_R8D);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff760);
      std::allocator<char>::~allocator(&local_6e9);
    }
    zmq::socket_t::close(local_70,iVar8);
    CommsInterface::setTxStatus(in_stack_fffffffffffff770,in_stack_fffffffffffff76c);
    zmq::message_t::~message_t((message_t *)in_stack_fffffffffffff760);
    std::
    map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
    ::~map((map<helics::route_id,_zmq::socket_t,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_zmq::socket_t>_>_>
            *)0x4d6af4);
    zmq::socket_t::~socket_t((socket_t *)0x4d6b01);
    local_124 = 0;
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff760);
  zmq::socket_t::~socket_t((socket_t *)0x4d6b26);
  std::shared_ptr<ZmqContextManager>::~shared_ptr((shared_ptr<ZmqContextManager> *)0x4d6b33);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff770);
  return;
}

Assistant:

void ZmqComms::queue_tx_function()
{
    std::vector<char> buffer;
    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    auto ctx = ZmqContextManager::getContextPointer();
    // Setup the control socket for comms with the receiver
    zmq::socket_t controlSocket(ctx->getBaseContext(), ZMQ_PAIR);
    controlSocket.setsockopt(ZMQ_LINGER, 200);
    std::string controlsockString =
        std::string("inproc://") + name + '_' + getRandomID() + "_control";
    controlSocket.connect(controlsockString);
    try {
        auto res = initializeBrokerConnections(controlSocket);
        if (res < 0) {
            setTxStatus((res != -3) ? ConnectionStatus::ERRORED : ConnectionStatus::TERMINATED);

            controlSocket.close();
            return;
        }
    }
    catch (const zmq::error_t&) {
        controlSocket.close();
        return;
    }

    zmq::socket_t brokerPushSocket(ctx->getBaseContext(), ZMQ_PUSH);
    brokerPushSocket.setsockopt(ZMQ_LINGER, 200);
    std::map<route_id, zmq::socket_t> routes;  // for all the other possible routes
    // ZmqRequestSets priority_routes;  //!< object to handle the management of the priority
    // routes

    if (hasBroker) {
        //   priority_routes.addRoutes (0, makePortAddress (brokerTargetAddress, brokerPort+1));
        brokerPushSocket.connect(makePortAddress(brokerTargetAddress, brokerPort));
    }
    setTxStatus(ConnectionStatus::CONNECTED);
    zmq::message_t msg;
    bool continueProcessing{true};
    while (continueProcessing) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (control_route == rid) {
                switch (cmd.messageID) {
                    case RECONNECT_TRANSMITTER:
                        setTxStatus(ConnectionStatus::CONNECTED);
                        break;
                    case NEW_BROKER_INFORMATION:
                        brokerPushSocket.close();
                        brokerPushSocket = zmq::socket_t(ctx->getBaseContext(), ZMQ_PUSH);
                        brokerPushSocket.setsockopt(ZMQ_LINGER, 200);
                        brokerTargetAddress = cmd.payload.to_string();
                        brokerPort = cmd.getExtraData();
                        brokerPushSocket.connect(makePortAddress(brokerTargetAddress, brokerPort));
                        break;
                    case NEW_ROUTE: {
                        try {
                            auto interfaceAndPort = gmlc::networking::extractInterfaceAndPort(
                                std::string(cmd.payload.to_string()));

                            auto zsock = zmq::socket_t(ctx->getBaseContext(), ZMQ_PUSH);
                            zsock.setsockopt(ZMQ_LINGER, 100);
                            zsock.connect(
                                makePortAddress(interfaceAndPort.first, interfaceAndPort.second));
                            routes.emplace(route_id{cmd.getExtraData()}, std::move(zsock));
                        }
                        catch (const zmq::error_t& e) {
                            // TODO(PT): do something???
                            logError(std::string("unable to connect route") +
                                     std::string(cmd.payload.to_string()) + "::" + e.what());
                        }
                        processed = true;
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case DISCONNECT:
                        continueProcessing = false;
                        processed = true;
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }
        if (getRouteTypeCode(rid) == json_route_code || useJsonSerialization) {
            auto str = cmd.to_json_string();
            buffer.resize(str.size());
            std::copy(str.begin(), str.end(), buffer.begin());

        } else {
            cmd.to_vector(buffer);
        }
        if (rid == parent_route_id) {
            if (hasBroker) {
                brokerPushSocket.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                      zmq::send_flags::none);
            } else {
                logWarning("no route to broker for message");
            }
        } else if (rid == control_route) {  // send to rx thread loop
            try {
                controlSocket.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                   zmq::send_flags::dontwait);
            }
            catch (const zmq::error_t& e) {
                if ((getRxStatus() == ConnectionStatus::TERMINATED) ||
                    (getRxStatus() == ConnectionStatus::ERRORED)) {
                    break;
                }
                logError(e.what());
            }
            continue;
        } else {
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                rt_find->second.send(zmq::const_buffer(buffer.data(), buffer.size()));
            } else {
                if (hasBroker) {
                    brokerPushSocket.send(zmq::const_buffer(buffer.data(), buffer.size()));
                } else {
                    if (!isIgnoreableCommand(cmd)) {
                        logWarning(std::string("unknown route and no broker, dropping message ") +
                                   prettyPrintString(cmd));
                    }
                }
            }
        }
    }
    brokerPushSocket.close();

    routes.clear();
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        try {
            controlSocket.send(std::string("close"), zmq::send_flags::dontwait);
        }
        catch (const zmq::error_t&) {
            // this probably just means it got closed simultaneously which would be unusual but
            // not impossible
        }
    }

    controlSocket.close();

    setTxStatus(ConnectionStatus::TERMINATED);
}